

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Own<CallResultHolder>::dispose(Own<CallResultHolder> *this)

{
  CallResultHolder *object;
  CallResultHolder *ptrCopy;
  Own<CallResultHolder> *this_local;
  
  object = this->ptr;
  if (object != (CallResultHolder *)0x0) {
    this->ptr = (CallResultHolder *)0x0;
    Disposer::
    dispose<capnp::QueuedClient::call(unsigned_long,unsigned_short,kj::Own<capnp::CallContextHook>&&)::CallResultHolder>
              (this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }